

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O2

InplaceStr GetTemporaryName(ExpressionContext *ctx,uint index,char *suffix)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar4;
  char *pcVar5;
  char *strEnd;
  undefined8 uStack_60;
  char buf [16];
  InplaceStr local_40;
  size_t sVar3;
  char *__s;
  
  buf[0] = (byte)(index % 10) | 0x30;
  lVar4 = 1;
  for (; 9 < index; index = (uint)((ulong)index / 10)) {
    buf[lVar4] = (byte)(((ulong)index / 10) % 10) | 0x30;
    lVar4 = lVar4 + 1;
  }
  if (suffix == (char *)0x0) {
    uVar1 = 0;
  }
  else {
    uStack_60 = (code *)0x1c8865;
    sVar3 = strlen(suffix);
    uVar1 = (uint)sVar3;
  }
  uStack_60 = (code *)0x1c8881;
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)(uVar1 + 0x10));
  __s = (char *)CONCAT44(extraout_var,iVar2);
  builtin_strncpy(__s,"$temp",5);
  strEnd = __s + 5;
  do {
    pcVar5 = strEnd;
    *pcVar5 = buf[lVar4 + -1];
    strEnd = pcVar5 + 1;
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  if (suffix != (char *)0x0) {
    *strEnd = '_';
    uStack_60 = (code *)0x1c88c0;
    memcpy(pcVar5 + 2,suffix,(ulong)uVar1);
    strEnd = strEnd + (ulong)uVar1 + 1;
  }
  *strEnd = '\0';
  uStack_60 = (code *)0x1c88d2;
  sVar3 = strlen(__s);
  if (sVar3 < uVar1 + 0x10) {
    uStack_60 = (code *)0x1c88ec;
    InplaceStr::InplaceStr(&local_40,__s,strEnd);
    return local_40;
  }
  uStack_60 = GetAlignmentOffset;
  __assert_fail("strlen(name) < nameLength",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                ,0x2ba,
                "InplaceStr GetTemporaryName(ExpressionContext &, unsigned int, const char *)");
}

Assistant:

InplaceStr GetTemporaryName(ExpressionContext &ctx, unsigned index, const char *suffix)
{
	char buf[16];

	char *curr = buf;

	*curr++ = (char)((index % 10) + '0');

	while(index /= 10)
		*curr++ = (char)((index % 10) + '0');

	unsigned suffixLength = suffix ? (unsigned)strlen(suffix) : 0;

	unsigned nameLength = 16 + suffixLength;
	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	memcpy(pos, "$temp", 5);
	pos += 5;

	do
	{
		--curr;
		*pos++ = *curr;
	}
	while(curr != buf);

	if(suffix)
	{
		*pos++ = '_';

		memcpy(pos, suffix, suffixLength);
		pos += suffixLength;
	}

	*pos = 0;

	assert(strlen(name) < nameLength);
	return InplaceStr(name, pos);
}